

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.cpp
# Opt level: O1

shared_ptr<ComplexType> __thiscall SNMPTrap::generateVarBindList(SNMPTrap *this)

{
  ASN_TYPE *pAVar1;
  ValueCallback *callback;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  SortableOIDType *pSVar2;
  SortableOIDType *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  bool *pbVar5;
  long *plVar6;
  long in_RSI;
  shared_ptr<ComplexType> sVar7;
  undefined1 local_110 [24];
  undefined1 local_f8 [8];
  SortableOIDType *pSStack_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Alloc_hider local_e0;
  SNMPTrap *local_d8;
  undefined1 local_d0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a4810;
  local_e8 = this_00 + 1;
  this_00[1]._M_use_count = 0x30;
  this_00[1]._M_weak_count = 0;
  local_e0._M_p = (pointer)&PTR__ComplexType_001a4058;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ComplexType_001a4058;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[2]._M_use_count = 0;
  this_00[2]._M_weak_count = 0;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  _Var4._M_pi = extraout_RDX;
  if (*(int *)(in_RSI + 0x48) == 1) {
    if (*(long *)(in_RSI + 0xe8) == 0) {
      (this->super_SNMPPacket)._vptr_SNMPPacket = (_func_int **)0x0;
      *(undefined8 *)&(this->super_SNMPPacket).reuse = 0;
      goto LAB_0016e6c9;
    }
    pSVar2 = (SortableOIDType *)operator_new(0x38);
    (pSVar2->super_OIDType).super_BER_CONTAINER._type = 1;
    (pSVar2->super_OIDType).super_BER_CONTAINER._length = 1;
    (pSVar2->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_001a4810;
    (pSVar2->super_OIDType)._value._M_dataplus._M_p = (pointer)0x30;
    *(pointer *)&(pSVar2->super_OIDType).valid = local_e0._M_p;
    (pSVar2->super_OIDType)._value._M_string_length = 0;
    (pSVar2->super_OIDType)._value.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pSVar2->super_OIDType)._value.field_2 + 8) = 0;
    OIDType::cloneOID((OIDType *)local_f8);
    pbVar5 = &(pSVar2->super_OIDType).valid;
    local_110._0_8_ = local_f8;
    local_110._8_8_ = pSStack_f0;
    local_f8 = (undefined1  [8])0x0;
    pSStack_f0 = (SortableOIDType *)0x0;
    ComplexType::addValueToList
              ((ComplexType *)&stack0xffffffffffffffc0,(shared_ptr<BER_CONTAINER> *)pbVar5);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if ((SortableOIDType *)local_110._8_8_ != (SortableOIDType *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
    if (pSStack_f0 != (SortableOIDType *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSStack_f0);
    }
    if (*(ValueCallback **)(in_RSI + 0xf0) == (ValueCallback *)0x0) {
      local_110._8_8_ = operator_new(0x28);
      (((SortableOIDType *)local_110._8_8_)->super_OIDType).super_BER_CONTAINER._type = 1;
      (((SortableOIDType *)local_110._8_8_)->super_OIDType).super_BER_CONTAINER._length = 1;
      (((SortableOIDType *)local_110._8_8_)->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER
           = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a3f80;
      local_110._0_8_ = &(((SortableOIDType *)local_110._8_8_)->super_OIDType).valid;
      *(undefined4 *)&(((SortableOIDType *)local_110._8_8_)->super_OIDType)._value._M_string_length
           = 0;
      *(undefined ***)&(((SortableOIDType *)local_110._8_8_)->super_OIDType).valid =
           &PTR__BER_CONTAINER_001a3fd0;
      (((SortableOIDType *)local_110._8_8_)->super_OIDType)._value._M_dataplus._M_p = (pointer)0x43;
      ComplexType::addValueToList((ComplexType *)local_60,(shared_ptr<BER_CONTAINER> *)pbVar5);
      pSVar3 = (SortableOIDType *)local_110._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
        pSVar3 = (SortableOIDType *)local_110._8_8_;
      }
    }
    else {
      ValueCallback::getValueForCallback
                ((ValueCallback *)local_f8,*(ValueCallback **)(in_RSI + 0xf0));
      if (pSStack_f0 != (SortableOIDType *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pAVar1 = &(pSStack_f0->super_OIDType).super_BER_CONTAINER._type;
          *pAVar1 = *pAVar1 + 1;
          UNLOCK();
        }
        else {
          pAVar1 = &(pSStack_f0->super_OIDType).super_BER_CONTAINER._type;
          *pAVar1 = *pAVar1 + 1;
        }
      }
      local_110._0_8_ = local_f8;
      local_110._8_8_ = pSStack_f0;
      ComplexType::addValueToList
                ((ComplexType *)(local_60 + 0x10),(shared_ptr<BER_CONTAINER> *)pbVar5);
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
      pSVar3 = pSStack_f0;
      if ((SortableOIDType *)local_110._8_8_ != (SortableOIDType *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
        pSVar3 = pSStack_f0;
      }
    }
    if (pSVar3 != (SortableOIDType *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar3);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      pAVar1 = &(pSVar2->super_OIDType).super_BER_CONTAINER._type;
      *pAVar1 = *pAVar1 + 1;
      UNLOCK();
    }
    else {
      pAVar1 = &(pSVar2->super_OIDType).super_BER_CONTAINER._type;
      *pAVar1 = *pAVar1 + 1;
    }
    local_110._0_8_ = pbVar5;
    local_110._8_8_ = pSVar2;
    ComplexType::addValueToList((ComplexType *)local_70,(shared_ptr<BER_CONTAINER> *)local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    if ((SortableOIDType *)local_110._8_8_ != (SortableOIDType *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
    pSVar3 = (SortableOIDType *)operator_new(0x38);
    (pSVar3->super_OIDType).super_BER_CONTAINER._type = 1;
    (pSVar3->super_OIDType).super_BER_CONTAINER._length = 1;
    (pSVar3->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_001a4810;
    (pSVar3->super_OIDType)._value._M_dataplus._M_p = (pointer)0x30;
    *(pointer *)&(pSVar3->super_OIDType).valid = local_e0._M_p;
    (pSVar3->super_OIDType)._value._M_string_length = 0;
    (pSVar3->super_OIDType)._value.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pSVar3->super_OIDType)._value.field_2 + 8) = 0;
    OIDType::cloneOID((OIDType *)local_f8);
    pbVar5 = &(pSVar3->super_OIDType).valid;
    local_110._0_8_ = local_f8;
    local_110._8_8_ = pSStack_f0;
    local_f8 = (undefined1  [8])0x0;
    pSStack_f0 = (SortableOIDType *)0x0;
    ComplexType::addValueToList((ComplexType *)local_80,(shared_ptr<BER_CONTAINER> *)pbVar5);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
    }
    if ((SortableOIDType *)local_110._8_8_ != (SortableOIDType *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
    if (pSStack_f0 != (SortableOIDType *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSStack_f0);
    }
    OIDType::cloneOID((OIDType *)local_f8);
    local_110._0_8_ = local_f8;
    local_110._8_8_ = pSStack_f0;
    local_f8 = (undefined1  [8])0x0;
    pSStack_f0 = (SortableOIDType *)0x0;
    ComplexType::addValueToList((ComplexType *)local_90,(shared_ptr<BER_CONTAINER> *)pbVar5);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
    }
    if ((SortableOIDType *)local_110._8_8_ != (SortableOIDType *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
    if (pSStack_f0 != (SortableOIDType *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSStack_f0);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      pAVar1 = &(pSVar3->super_OIDType).super_BER_CONTAINER._type;
      *pAVar1 = *pAVar1 + 1;
      UNLOCK();
    }
    else {
      pAVar1 = &(pSVar3->super_OIDType).super_BER_CONTAINER._type;
      *pAVar1 = *pAVar1 + 1;
    }
    local_110._0_8_ = pbVar5;
    local_110._8_8_ = pSVar3;
    ComplexType::addValueToList((ComplexType *)local_a0,(shared_ptr<BER_CONTAINER> *)local_e8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
    }
    if ((SortableOIDType *)local_110._8_8_ != (SortableOIDType *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
    }
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar3);
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar2);
    _Var4._M_pi = extraout_RDX_00;
  }
  plVar6 = *(long **)(in_RSI + 0x108);
  local_110._16_8_ = this_00;
  local_d8 = this;
  if (plVar6 != (long *)(in_RSI + 0x108)) {
    do {
      callback = (ValueCallback *)plVar6[2];
      if (callback != (ValueCallback *)0x0) {
        pSVar2 = (SortableOIDType *)operator_new(0x38);
        (pSVar2->super_OIDType).super_BER_CONTAINER._type = 1;
        (pSVar2->super_OIDType).super_BER_CONTAINER._length = 1;
        (pSVar2->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_001a4810;
        (pSVar2->super_OIDType)._value._M_dataplus._M_p = (pointer)0x30;
        *(pointer *)&(pSVar2->super_OIDType).valid = local_e0._M_p;
        (pSVar2->super_OIDType)._value._M_string_length = 0;
        (pSVar2->super_OIDType)._value.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(pSVar2->super_OIDType)._value.field_2 + 8) = 0;
        OIDType::cloneOID((OIDType *)local_f8);
        pbVar5 = &(pSVar2->super_OIDType).valid;
        local_110._0_8_ = local_f8;
        local_110._8_8_ = pSStack_f0;
        local_f8 = (undefined1  [8])0x0;
        pSStack_f0 = (SortableOIDType *)0x0;
        ComplexType::addValueToList((ComplexType *)local_b0,(shared_ptr<BER_CONTAINER> *)pbVar5);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
        }
        if ((SortableOIDType *)local_110._8_8_ != (SortableOIDType *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
        }
        if (pSStack_f0 != (SortableOIDType *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSStack_f0);
        }
        ValueCallback::getValueForCallback((ValueCallback *)local_110,callback);
        ComplexType::addValueToList
                  ((ComplexType *)(local_d0 + 0x10),(shared_ptr<BER_CONTAINER> *)pbVar5);
        if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
        }
        if ((SortableOIDType *)local_110._8_8_ != (SortableOIDType *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          pAVar1 = &(pSVar2->super_OIDType).super_BER_CONTAINER._type;
          *pAVar1 = *pAVar1 + 1;
          UNLOCK();
        }
        else {
          pAVar1 = &(pSVar2->super_OIDType).super_BER_CONTAINER._type;
          *pAVar1 = *pAVar1 + 1;
        }
        local_110._0_8_ = pbVar5;
        local_110._8_8_ = pSVar2;
        ComplexType::addValueToList((ComplexType *)local_d0,(shared_ptr<BER_CONTAINER> *)local_e8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
        }
        if ((SortableOIDType *)local_110._8_8_ != (SortableOIDType *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._8_8_);
        }
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar2);
        _Var4._M_pi = extraout_RDX_01;
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)(in_RSI + 0x108));
  }
  (local_d8->super_SNMPPacket)._vptr_SNMPPacket = (_func_int **)local_e8;
  *(undefined8 *)&(local_d8->super_SNMPPacket).reuse = local_110._16_8_;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = local_d8;
LAB_0016e6c9:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var4._M_pi = extraout_RDX_02;
  }
  sVar7.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar7.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ComplexType>)sVar7.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ComplexType> SNMPTrap::generateVarBindList(){
    SNMP_LOGD("generateVarBindList from SNMPTrap");
    auto ourVBList = std::make_shared<ComplexType>(STRUCTURE);
    // If we're an SNMPv2 Trap, our first two are timestamp and OIDType, v1 already has them included
    if(this->snmpVersion == SNMP_VERSION_2C){
        if(!this->trapOID){
            return nullptr;
        }
        // Timestamp
        auto timestampVarBind = std::make_shared<ComplexType>(STRUCTURE);
        timestampVarBind->addValueToList(timestampOID->cloneOID());

        if(uptimeCallback){
            timestampVarBind->addValueToList(std::static_pointer_cast<TimestampType>(ValueCallback::getValueForCallback(uptimeCallback)));
        } else {
            timestampVarBind->addValueToList(std::make_shared<TimestampType>(0));
        }
        ourVBList->addValueToList(timestampVarBind);

        // OID
        auto oidVarBind = std::make_shared<ComplexType>(STRUCTURE);
        oidVarBind->addValueToList(snmpTrapOID->cloneOID());
        oidVarBind->addValueToList(trapOID->cloneOID());
        ourVBList->addValueToList(oidVarBind);
    }

    for(auto value : this->callbacks){
        if(!value) continue;
        auto varBind = std::make_shared<ComplexType>(STRUCTURE);

        varBind->addValueToList(value->OID->cloneOID());
        varBind->addValueToList(ValueCallback::getValueForCallback(value));

        ourVBList->addValueToList(varBind);
    }

    return ourVBList;
}